

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O1

void UnitTests::stream_any_details::output_range_or_type<std::vector<int,std::allocator<int>>>
               (ostream *s,vector<int,_std::allocator<int>_> *t,true_type *param_3)

{
  int *piVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"[",1);
  piVar1 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar1 != (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish) {
    std::ostream::operator<<((ostream *)s,*piVar1);
    std::
    for_each<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,UnitTests::stream_any_details::output_range_or_type<std::vector<int,std::allocator<int>>>(std::ostream&,std::vector<int,std::allocator<int>>const&,std::integral_constant<bool,true>const&)::_lambda(auto:1_const&)_1_>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar1 + 1)
               ,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish,(anon_class_8_1_54a39813)s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"]",1);
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::true_type& /*unused*/)
        {
            s << "[";
            if (begin(t) != end(t))
            {
                auto first = begin(t);
                s << stream_any(*first++);
                std::for_each(first, end(t), [&s](const auto& value) { s << ", " << stream_any(value); });
            }
            s << "]";
        }